

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

int QUtf8::compareUtf8(QByteArrayView utf8,QStringView utf16,CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  storage_type_conflict *psVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined7 uVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [15];
  uint5 uVar20;
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [11];
  undefined1 auVar24 [13];
  undefined1 auVar25 [15];
  undefined1 auVar26 [11];
  undefined1 auVar27 [13];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  uint7 uVar32;
  char32_t ucs4;
  char32_t ucs4_00;
  long lVar33;
  ulong uVar34;
  sbyte sVar35;
  storage_type_conflict *psVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  ushort uVar41;
  uint uVar42;
  storage_type_conflict *psVar43;
  byte *pbVar44;
  byte *pbVar45;
  bool bVar46;
  storage_type_conflict sVar47;
  byte bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  
  psVar36 = utf16.m_data;
  pbVar45 = (byte *)utf8.m_data;
  pbVar44 = pbVar45 + utf8.m_size;
  psVar1 = psVar36 + utf16.m_size;
  do {
    lVar33 = (long)psVar1 - (long)psVar36 >> 1;
    if ((long)pbVar44 - (long)pbVar45 < lVar33) {
      lVar33 = (long)pbVar44 - (long)pbVar45;
    }
    sVar35 = 1;
    if (lVar33 < 0x11) {
      uVar39 = 0;
      uVar37 = 0;
    }
    else {
      uVar34 = 0;
      sVar35 = 1;
      do {
        auVar50 = *(undefined1 (*) [16])(pbVar45 + uVar34);
        psVar43 = psVar36 + uVar34;
        psVar2 = psVar36 + uVar34 + 8;
        auVar5[0xd] = 0;
        auVar5._0_13_ = auVar50._0_13_;
        auVar5[0xe] = auVar50[7];
        auVar7[0xc] = auVar50[6];
        auVar7._0_12_ = auVar50._0_12_;
        auVar7._13_2_ = auVar5._13_2_;
        auVar9[0xb] = 0;
        auVar9._0_11_ = auVar50._0_11_;
        auVar9._12_3_ = auVar7._12_3_;
        auVar11[10] = auVar50[5];
        auVar11._0_10_ = auVar50._0_10_;
        auVar11._11_4_ = auVar9._11_4_;
        auVar13[9] = 0;
        auVar13._0_9_ = auVar50._0_9_;
        auVar13._10_5_ = auVar11._10_5_;
        auVar15[8] = auVar50[4];
        auVar15._0_8_ = auVar50._0_8_;
        auVar15._9_6_ = auVar13._9_6_;
        auVar21._7_8_ = 0;
        auVar21._0_7_ = auVar15._8_7_;
        Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),auVar50[3]);
        auVar28._9_6_ = 0;
        auVar28._0_9_ = Var22;
        auVar23._1_10_ = SUB1510(auVar28 << 0x30,5);
        auVar23[0] = auVar50[2];
        auVar29._11_4_ = 0;
        auVar29._0_11_ = auVar23;
        auVar24._1_12_ = SUB1512(auVar29 << 0x20,3);
        auVar24[0] = auVar50[1];
        auVar52._0_2_ = -(ushort)((ushort)auVar50[0] == *psVar43);
        auVar52._2_2_ = -(ushort)(auVar24._0_2_ == psVar43[1]);
        auVar52._4_2_ = -(ushort)(auVar23._0_2_ == psVar43[2]);
        auVar52._6_2_ = -(ushort)((storage_type_conflict)Var22 == psVar43[3]);
        auVar52._8_2_ = -(ushort)(auVar15._8_2_ == psVar43[4]);
        auVar52._10_2_ = -(ushort)(auVar11._10_2_ == psVar43[5]);
        auVar52._12_2_ = -(ushort)(auVar7._12_2_ == psVar43[6]);
        auVar52._14_2_ = -(ushort)((storage_type_conflict)(auVar5._13_2_ >> 8) == psVar43[7]);
        auVar49._0_2_ = -(ushort)((ushort)auVar50[8] == *psVar2);
        auVar49._2_2_ = -(ushort)((ushort)auVar50[9] == psVar2[1]);
        auVar49._4_2_ = -(ushort)((ushort)auVar50[10] == psVar2[2]);
        auVar49._6_2_ = -(ushort)((ushort)auVar50[0xb] == psVar2[3]);
        auVar49._8_2_ = -(ushort)((ushort)auVar50[0xc] == psVar2[4]);
        auVar49._10_2_ = -(ushort)((ushort)auVar50[0xd] == psVar2[5]);
        auVar49._12_2_ = -(ushort)((ushort)auVar50[0xe] == psVar2[6]);
        auVar49._14_2_ = -(ushort)((ushort)auVar50[0xf] == psVar2[7]);
        uVar38 = CONCAT22((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                          (ushort)((byte)(auVar49._14_2_ >> 7) & 1) << 0xe | auVar49._14_2_ & 0x8000
                          ,(ushort)(SUB161(auVar52 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                           (ushort)((byte)(auVar52._14_2_ >> 7) & 1) << 0xe |
                           auVar52._14_2_ & 0x8000);
        if (uVar38 == 0xffffffff) {
          uVar41 = (ushort)(SUB161(auVar50 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar50[0xf] >> 7) << 0xf;
          uVar39 = (ulong)uVar41;
          bVar46 = uVar41 == 0;
          if (!bVar46) {
            sVar35 = 0;
          }
        }
        else {
          uVar39 = (ulong)~uVar38;
          bVar46 = false;
        }
        uVar37 = uVar34;
      } while ((bVar46) &&
              (uVar37 = uVar34 + 0x10, lVar40 = uVar34 + 0x20, uVar34 = uVar37, lVar40 < lVar33));
    }
    if (((int)uVar39 == 0) && ((long)(uVar37 | 8) < lVar33)) {
      uVar39 = *(ulong *)(pbVar45 + uVar37);
      psVar43 = psVar36 + uVar37;
      bVar48 = (byte)(uVar39 >> 0x38);
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar39;
      auVar6[0xe] = bVar48;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar39;
      auVar8[0xc] = (char)(uVar39 >> 0x30);
      auVar8._13_2_ = auVar6._13_2_;
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar39;
      auVar10._12_3_ = auVar8._12_3_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar39;
      auVar12[10] = (char)(uVar39 >> 0x28);
      auVar12._11_4_ = auVar10._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar39;
      auVar14._10_5_ = auVar12._10_5_;
      auVar16[8] = (char)(uVar39 >> 0x20);
      auVar16._0_8_ = uVar39;
      auVar16._9_6_ = auVar14._9_6_;
      auVar25._7_8_ = 0;
      auVar25._0_7_ = auVar16._8_7_;
      Var22 = CONCAT81(SUB158(auVar25 << 0x40,7),(char)(uVar39 >> 0x18));
      auVar30._9_6_ = 0;
      auVar30._0_9_ = Var22;
      auVar26._1_10_ = SUB1510(auVar30 << 0x30,5);
      auVar26[0] = (char)(uVar39 >> 0x10);
      auVar31._11_4_ = 0;
      auVar31._0_11_ = auVar26;
      auVar18 = SUB1512(auVar31 << 0x20,3);
      auVar27._1_12_ = auVar18;
      auVar27[0] = (char)(uVar39 >> 8);
      sVar47 = CONCAT11(0,(byte)uVar39);
      auVar19._2_13_ = auVar27;
      auVar19._0_2_ = sVar47;
      auVar50._0_2_ = -(ushort)(*psVar43 == sVar47);
      auVar50._2_2_ = -(ushort)(psVar43[1] == auVar27._0_2_);
      auVar50._4_2_ = -(ushort)(psVar43[2] == auVar26._0_2_);
      auVar50._6_2_ = -(ushort)(psVar43[3] == (storage_type_conflict)Var22);
      auVar50._8_2_ = -(ushort)(psVar43[4] == auVar16._8_2_);
      auVar50._10_2_ = -(ushort)(psVar43[5] == auVar12._10_2_);
      auVar50._12_2_ = -(ushort)(psVar43[6] == auVar8._12_2_);
      auVar50._14_2_ = -(ushort)(psVar43[7] == (storage_type_conflict)(auVar6._13_2_ >> 8));
      uVar41 = (ushort)SUB151(auVar19 >> 7,0) | (ushort)SUB131(auVar27 >> 7,0) << 2 |
               (ushort)SUB121(auVar18 >> 0xf,0) << 4 | (ushort)SUB121(auVar18 >> 0x1f,0) << 6 |
               (ushort)(SUB121(auVar18 >> 0x2f,0) & 1) << 8 |
               (ushort)(SUB121(auVar18 >> 0x37,0) & 1) << 9 |
               (ushort)(SUB121(auVar18 >> 0x3f,0) & 1) << 10 |
               (ushort)(SUB121(auVar18 >> 0x47,0) & 1) << 0xb |
               (ushort)(SUB121(auVar18 >> 0x4f,0) & 1) << 0xc |
               (ushort)(SUB121(auVar18 >> 0x57,0) & 1) << 0xd | (ushort)(bVar48 >> 7) << 0xe |
               ~((ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                 (ushort)((byte)(auVar50._14_2_ >> 7) & 1) << 0xe | auVar50._14_2_ & 0x8000);
      uVar39 = (ulong)uVar41;
      if (uVar41 == 0) {
        uVar37 = uVar37 | 8;
      }
    }
    if (((int)uVar39 == 0) && ((long)(uVar37 + 4) < lVar33)) {
      uVar4 = *(undefined4 *)(pbVar45 + uVar37);
      uVar3 = *(undefined8 *)(psVar36 + uVar37);
      bVar48 = (byte)((uint)uVar4 >> 0x18);
      uVar17 = CONCAT25((short)(((uint7)bVar48 << 0x30) >> 0x28),
                        CONCAT14((char)((uint)uVar4 >> 0x10),uVar4));
      uVar32 = (uint7)CONCAT41((int)(CONCAT34((int3)((uint7)uVar17 >> 0x20),uVar4) >> 0x18),
                               (char)((uint)uVar4 >> 8)) & 0xffffff00ff;
      uVar20 = (uint5)uVar32;
      auVar51._0_2_ = -(ushort)((ushort)uVar3 == (ushort)(byte)uVar4);
      auVar51._2_2_ = -(ushort)((short)((ulong)uVar3 >> 0x10) == (short)uVar32);
      auVar51._4_2_ = -(ushort)((short)((ulong)uVar3 >> 0x20) == (short)((uint7)uVar17 >> 0x20));
      auVar51._6_2_ = -(ushort)((ushort)((ulong)uVar3 >> 0x30) == (ushort)bVar48);
      auVar51._8_2_ = 0xffff;
      auVar51._10_2_ = 0xffff;
      auVar51._12_2_ = 0xffff;
      auVar51._14_2_ = 0xffff;
      uVar38 = ~(uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7) & 0xff;
      uVar42 = (uint)(ushort)((ushort)(byte)(CONCAT52(uVar20,(ushort)(byte)uVar4) >> 7) |
                              (ushort)(byte)(uVar20 >> 7) << 2 | (ushort)(byte)(uVar20 >> 0x17) << 4
                             | (ushort)(byte)((byte)(uVar32 >> 0x20) >> 7) << 6);
      uVar39 = (ulong)(uVar42 | uVar38);
      if (uVar42 == 0 && uVar38 == 0) {
        uVar37 = uVar37 + 4;
      }
    }
    uVar38 = (uint)uVar39;
    if (uVar38 == 0) {
      uVar42 = 0x20;
    }
    else {
      uVar42 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
    }
    uVar34 = (ulong)(uVar42 >> sVar35);
    if (uVar38 == 0) {
      uVar34 = uVar39;
    }
    pbVar45 = pbVar45 + uVar37 + uVar34;
    psVar36 = psVar36 + uVar37 + uVar34;
    if ((pbVar45 < pbVar44) && (psVar36 < psVar1)) {
      psVar43 = psVar36 + 1;
      ucs4_00 = (char32_t)(ushort)*psVar36;
      ucs4 = (char32_t)*pbVar45;
      if (((char)*pbVar45 < '\0') &&
         ((ucs4 = L'�', psVar43 < psVar1 && (ucs4_00 & 0xfc00U) == 0xd800 &&
          (sVar47 = *psVar43, ((ushort)sVar47 & 0xfc00) == 0xdc00)))) {
        psVar43 = psVar36 + 2;
        ucs4_00 = (uint)(ushort)*psVar36 * 0x400 + (uint)(ushort)sVar47 + L'\xfca02400';
      }
      if (cs == CaseInsensitive) {
        ucs4 = QChar::toCaseFolded(ucs4);
        ucs4_00 = QChar::toCaseFolded(ucs4_00);
      }
      psVar36 = psVar43;
      pbVar45 = pbVar45 + 1;
      if (ucs4 - ucs4_00 != 0) {
        return ucs4 - ucs4_00;
      }
    }
    if ((pbVar44 <= pbVar45) || (psVar1 <= psVar36)) {
      return (uint)(pbVar45 < pbVar44) - (uint)(psVar36 < psVar1);
    }
  } while( true );
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView utf8, QStringView utf16, Qt::CaseSensitivity cs) noexcept
{
    auto src1 = reinterpret_cast<const qchar8_t *>(utf8.data());
    auto end1 = src1 + utf8.size();
    auto src2 = reinterpret_cast<const char16_t *>(utf16.data());
    auto end2 = src2 + utf16.size();

    do {
        simdCompareAscii(src1, end1, src2, end2);

        if (src1 < end1 && src2 < end2) {
            char32_t uc1 = *src1++;
            char32_t uc2 = *src2++;

            if (uc1 >= 0x80) {
                char32_t *output = &uc1;
                qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraitsNoAscii>(uc1, output, src1, end1);
                if (res < 0) {
                    // decoding error
                    uc1 = QChar::ReplacementCharacter;
                }

                // Only decode the UTF-16 surrogate pair if the UTF-8 code point
                // wasn't US-ASCII (a surrogate cannot match US-ASCII).
                if (QChar::isHighSurrogate(uc2) && src2 < end2 && QChar::isLowSurrogate(*src2))
                    uc2 = QChar::surrogateToUcs4(uc2, *src2++);
            }
            if (cs == Qt::CaseInsensitive) {
                uc1 = QChar::toCaseFolded(uc1);
                uc2 = QChar::toCaseFolded(uc2);
            }
            if (uc1 != uc2)
                return int(uc1) - int(uc2);
        }
    } while (src1 < end1 && src2 < end2);

    // the shorter string sorts first
    return (end1 > src1) - int(end2 > src2);
}